

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O3

void __thiscall Memory::Write8(Memory *this,uint16_t addr,uint8_t value)

{
  uint __fd;
  uint8_t uVar1;
  uint8_t *puVar2;
  size_t in_RCX;
  undefined6 in_register_00000032;
  uint16_t i;
  long lVar3;
  
  if ((uint)CONCAT62(in_register_00000032,addr) < 0x2000) {
    this->ram[addr & 0x7ff] = value;
  }
  else {
    __fd = (uint)addr;
    if (__fd < 0x4000) {
      PPU::Write(this->ppu,addr & 7,value);
      return;
    }
    if (__fd < 0x4018) {
      if (__fd != 0x4017) {
        if (__fd == 0x4016) {
          Controller::Write(this->controller,value);
          return;
        }
        if (__fd != 0x4014) {
          APU::write(this->apu,__fd,(void *)(ulong)value,in_RCX);
          return;
        }
        puVar2 = PPU::getOAMRAM(this->ppu);
        lVar3 = 0;
        do {
          uVar1 = Read8(this,(ushort)value * 0x100 + (short)lVar3);
          puVar2[lVar3] = uVar1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x100);
        this->addCyclesAfterDMA = 0x201;
      }
    }
    else if (0x401f < __fd) {
      if (0x5fff < (short)addr) {
        ROM::WriteSRAM(this->rom,addr + 0xa000,value);
        return;
      }
      ROM::Write(this->rom,addr,value);
      return;
    }
  }
  return;
}

Assistant:

void Memory::Write8(uint16_t addr, uint8_t value) {
    if (addr >= 0 && addr <= 0x1FFF) {
        ram[addr % 0x0800] = value;
    } else if (addr >= 0x2000 && addr <= 0x3FFF) {
        ppu->Write(addr % 8, value);
    } else if (addr >= 0x4000 && addr <= 0x4017) {
        if (addr == 0x4014) { // broken stuff
            uint8_t *where = ppu->getOAMRAM();
            for (uint16_t i = 0; i < 0x100; i++) {
                where[i] = Read8((value << 8) + i);
            }
            addCyclesAfterDMA = 513;
        } else if (addr == 0x4016) {
            controller->Write(value);
        } else if (addr == 0x4017) {
        	// TODO: not implemented
        } else {
        	apu->write(addr, value);
        }
    } else if (addr >= 0x4018 && addr <= 0x401F) {
        // I/O registers from test mode cpu
    } else if (addr >= 0x4020 && addr <= 0xFFFF) {
        if (addr >= 0x6000 && addr <= 0x7FFF) {
            rom->WriteSRAM(addr - 0x6000, value);
        } else {
            rom->Write(addr, value);
        }

    }
}